

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int util_scan_files(char *dir,char ***result)

{
  dirent *pdVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  char *__dest;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  char **filelist;
  dirent **files;
  size_t capacity;
  char **subdirs;
  stat stat_buf;
  char **local_100;
  dirent **local_f8;
  ulong local_f0;
  char *local_e8;
  size_t local_e0;
  char ***local_d8;
  ulong local_d0;
  char **local_c8;
  stat local_c0;
  
  iVar3 = stat(dir,&local_c0);
  if (iVar3 == -1) {
    return -1;
  }
  if ((local_c0.st_mode & 0xf000) != 0x4000) {
    return -1;
  }
  uVar4 = scandir(dir,&local_f8,util_scan_files_comp,alphasort);
  if ((int)uVar4 < 0) {
    return -1;
  }
  lVar10 = 0;
  local_100 = (char **)0x0;
  local_e0 = 0;
  iVar3 = util_vec_ensure(&local_100,&local_e0,8,8);
  if (iVar3 != 0) {
    return -1;
  }
  if (uVar4 != 0) {
    local_d0 = (ulong)uVar4;
    local_f0 = 0;
    lVar9 = 0;
    local_e8 = dir;
    local_d8 = result;
    do {
      pdVar1 = local_f8[local_f0];
      pcVar7 = pdVar1->d_name;
      sVar5 = strlen(dir);
      sVar6 = strlen(pcVar7);
      __dest = (char *)malloc(sVar5 + sVar6 + 3);
      strcpy(__dest,dir);
      if (dir[sVar5 - 1] != '/') {
        sVar5 = strlen(__dest);
        (__dest + sVar5)[0] = '/';
        (__dest + sVar5)[1] = '\0';
      }
      strcat(__dest,pcVar7);
      iVar3 = stat(__dest,&local_c0);
      uVar8 = local_f0;
      lVar10 = lVar9;
      if (iVar3 == -1) {
        free(local_f8[local_f0]);
        free(__dest);
      }
      else if ((local_c0.st_mode & 0xf000) == 0x4000) {
        sVar5 = strlen(pcVar7);
        if (pdVar1->d_name[sVar5 - 1] != '/') {
          sVar5 = strlen(__dest);
          (__dest + sVar5)[0] = '/';
          (__dest + sVar5)[1] = '\0';
        }
        uVar4 = util_scan_files(__dest,&local_c8);
        ppcVar2 = local_c8;
        if (0 < (int)uVar4) {
          uVar8 = 1;
          do {
            sVar5 = strlen(ppcVar2[uVar8 - 1]);
            pcVar7 = (char *)malloc(sVar5 + 1);
            local_100[lVar9] = pcVar7;
            lVar10 = lVar9 + 1;
            strcpy(pcVar7,ppcVar2[uVar8 - 1]);
            free(ppcVar2[uVar8 - 1]);
            iVar3 = util_vec_ensure(&local_100,&local_e0,lVar9 + 2,8);
            if (iVar3 != 0) goto LAB_001039af;
            bVar11 = uVar8 != uVar4;
            uVar8 = uVar8 + 1;
            lVar9 = lVar10;
          } while (bVar11);
        }
        free(ppcVar2);
        uVar8 = local_f0;
        free(local_f8[local_f0]);
        free(__dest);
        dir = local_e8;
        result = local_d8;
      }
      else {
        lVar10 = lVar9 + 1;
        local_100[lVar9] = __dest;
        iVar3 = util_vec_ensure(&local_100,&local_e0,lVar9 + 2,8);
        uVar8 = local_f0;
        if (iVar3 != 0) {
LAB_001039af:
          ppcVar2 = local_100;
          if (local_100 != (char **)0x0) {
            for (; lVar10 != 0; lVar10 = lVar10 + -1) {
              free(ppcVar2[lVar10 + -1]);
            }
            free(ppcVar2);
            return -1;
          }
          return -1;
        }
        free(local_f8[local_f0]);
        dir = local_e8;
      }
      local_f0 = uVar8 + 1;
      lVar9 = lVar10;
    } while (local_f0 != local_d0);
  }
  *result = local_100;
  return (int)lVar10;
}

Assistant:

int
util_scan_files(
    const char* dir,
    char*** result)
{
    struct stat stat_buf;
    if (stat(dir, &stat_buf) == -1)
        return -1;
    // We can only scan directories
    if (!S_ISDIR(stat_buf.st_mode))
        return -1;

    struct dirent **files;
    int n;
    n = scandir(dir, &files, util_scan_files_comp, alphasort);
    if (n < 0)
        return -1;

    char** filelist = NULL;
    size_t size = 0, capacity = 0;
    if (util_vec_ensure(&filelist, &capacity, 8, sizeof(char*)))
        return -1;
    for (int i = 0; i < n; ++i) {
        const char* name = files[i]->d_name;
        char* fullpath = malloc(strlen(dir)+strlen(name)+3);
        strcpy(fullpath, dir);
        if (dir[strlen(dir)-1] != '/') strcat(fullpath, "/");
        strcat(fullpath, name);
        if (stat(fullpath, &stat_buf) == -1) {
            free(files[i]);
            free(fullpath);
            continue;
        }
        if (S_ISDIR(stat_buf.st_mode)) {
            char** subdirs;
            if (name[strlen(name)-1] != '/') strcat(fullpath, "/");
            int new_cnt = util_scan_files(fullpath, &subdirs);
            for (int j = 0; j < new_cnt; j++) {
                filelist[size] = malloc(strlen(subdirs[j])+1);
                strcpy(filelist[size++], subdirs[j]);
                free(subdirs[j]);

                if (util_vec_ensure(&filelist, &capacity, size+1, sizeof(char*)))
                    goto err;
            }
            free(subdirs);
            free(files[i]);
            free(fullpath);
            continue;
        }
        filelist[size++] = fullpath;
        if (util_vec_ensure(&filelist, &capacity, size+1, sizeof(char*)))
            goto err;
        free(files[i]);
    }
    *result = filelist;
    return size;
err:
    if (filelist) {
        while (size--)
            free(filelist[size]);
        free(filelist);
    }
    return -1;
}